

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffmkky(char *keyname,char *value,char *comm,char *card,int *status)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  char tmpname [75];
  char tmpname2 [75];
  int local_10c;
  char *local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  char *local_e8;
  undefined8 local_e0;
  char local_d8;
  undefined7 uStack_d7;
  char local_d0;
  char local_88 [88];
  
  local_10c = -1;
  if (0 < *status) {
    return *status;
  }
  local_d8 = '\0';
  local_88[0] = '\0';
  *card = '\0';
  pcVar7 = keyname + -1;
  do {
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar1 == ' ');
  local_e8 = keyname;
  strncat(&local_d8,pcVar7,0x4a);
  local_f8 = strlen(value);
  sVar6 = strlen(&local_d8);
  if (sVar6 == 0) {
    pcVar7 = strchr(&local_d8,0x3d);
    if (pcVar7 != (char *)0x0) {
LAB_001398e5:
      pcVar7 = "Illegal keyword name; contains an equals sign (=)";
LAB_001398ec:
      ffxmsg(5,pcVar7);
      pcVar7 = &local_d8;
      goto LAB_00139900;
    }
    puVar10 = (undefined1 *)0x0;
LAB_0013992f:
    iVar4 = fftkey(&local_d8,&local_10c);
    if (0 < iVar4) goto LAB_00139942;
    strcat(card,&local_d8);
    if (puVar10 < (undefined1 *)0x8) {
      memset(card + (long)puVar10,0x20,8 - (long)puVar10);
    }
    card[8] = '=';
    card[9] = ' ';
    card[10] = '\0';
    if (local_f8 != 0) {
      puVar10 = (undefined1 *)0xa;
      bVar3 = false;
      iVar4 = 0;
      local_108 = value;
      local_100 = comm;
      if (*value == '\'') goto LAB_00139c1d;
      goto LAB_00139c97;
    }
    iVar4 = 0;
    bVar3 = false;
    local_100 = comm;
LAB_00139cd9:
    card[8] = ' ';
    if (local_100 == (char *)0x0) goto LAB_00139d77;
    sVar6 = 0x46;
    pcVar7 = local_100;
  }
  else {
    cVar2 = *(char *)((long)&local_e0 + sVar6 + 7);
    puVar10 = (undefined1 *)((long)&local_e0 + sVar6 + 7);
    while (cVar2 == ' ') {
      *puVar10 = 0;
      cVar2 = puVar10[-1];
      puVar10 = puVar10 + -1;
    }
    pcVar7 = strchr(&local_d8,0x3d);
    if (pcVar7 != (char *)0x0) goto LAB_001398e5;
    puVar10 = puVar10 + (1 - (long)&local_d8);
    if (puVar10 < (undefined1 *)0x9) goto LAB_0013992f;
LAB_00139942:
    if (local_d8 == 'h') {
      lVar8 = 0x6863726172656968;
LAB_001399da:
      if (local_d0 != ' ' || lVar8 != CONCAT71(uStack_d7,local_d8)) goto LAB_001399f1;
      local_108 = value;
      local_100 = comm;
      strcat(card,&local_d8);
      lVar8 = local_f8 + 3;
      sVar6 = strlen(card);
      pcVar7 = card + sVar6;
      if (puVar10 + lVar8 < (undefined1 *)0x51) {
        puVar10 = puVar10 + 3;
        builtin_strncpy(card + sVar6," = ",4);
      }
      else {
        pcVar7[2] = '\0';
        pcVar7[0] = '=';
        pcVar7[1] = ' ';
        puVar10 = puVar10 + 2;
      }
      iVar4 = 0;
      bVar3 = false;
    }
    else {
      if (local_d8 == 'H') {
        lVar8 = 0x4843524152454948;
        goto LAB_001399da;
      }
LAB_001399f1:
      strncat(local_88,&local_d8,0x4a);
      pcVar7 = strtok(local_88," ");
      if (pcVar7 == (char *)0x0) {
        local_10c = -1;
        iVar4 = fftkey(&local_d8,&local_10c);
        if (0 < iVar4) {
          pcVar7 = "Illegal keyword name:";
          goto LAB_001398ec;
        }
        local_108 = value;
        local_100 = comm;
        strncat(card,&local_d8,0x4a);
        sVar6 = strlen(card);
        (card + sVar6)[0] = '=';
        (card + sVar6)[1] = ' ';
        card[sVar6 + 2] = '\0';
        puVar10 = puVar10 + 2;
        iVar4 = 0;
        bVar3 = false;
      }
      else {
        bVar3 = false;
        iVar4 = 0;
        local_108 = value;
        local_100 = comm;
        local_f0 = card;
        local_e0 = status;
        do {
          local_10c = -1;
          iVar5 = fftkey(pcVar7,&local_10c);
          if (0 < iVar5) {
            bVar3 = true;
          }
          pcVar7 = strtok((char *)0x0," ");
          pcVar1 = local_f0;
          iVar4 = iVar4 + 1;
        } while (pcVar7 != (char *)0x0);
        if (puVar10 + -0x46 < (undefined1 *)0xffffffffffffffaf) {
          ffxmsg(5,"The following keyword is too long to fit on a card:");
          ffxmsg(5,local_e8);
          *local_e0 = 0xcf;
          return 0xcf;
        }
        sVar6 = strlen(local_f0);
        builtin_strncpy(pcVar1 + sVar6,"HIERARCH ",10);
        strcat(pcVar1,&local_d8);
        lVar8 = local_f8 + 0xc;
        sVar6 = strlen(pcVar1);
        pcVar7 = pcVar1 + sVar6;
        card = local_f0;
        status = local_e0;
        if (puVar10 + lVar8 < (undefined1 *)0x51) {
          puVar10 = puVar10 + 0xc;
          builtin_strncpy(pcVar1 + sVar6," = ",4);
        }
        else {
          pcVar7[2] = '\0';
          pcVar7[0] = '=';
          pcVar7[1] = ' ';
          puVar10 = puVar10 + 0xb;
        }
      }
    }
    if (local_f8 == 0) {
      if (puVar10 != (undefined1 *)0xa) goto LAB_00139d77;
      goto LAB_00139cd9;
    }
    if (*local_108 == '\'') {
      if (puVar10 < (undefined1 *)0x4e) {
LAB_00139c1d:
        strncat(card,local_108,0x50 - (long)puVar10);
        puVar10 = puVar10 + local_f8;
        puVar11 = puVar10;
        if ((undefined1 *)0x4f < puVar10) {
          card[0x4f] = '\'';
          puVar11 = (undefined1 *)0x50;
        }
        if (local_100 == (char *)0x0) goto LAB_00139d77;
        if ((puVar10 < (undefined1 *)0x1e) && (*local_100 != '\0')) {
          memset(card + (long)puVar11,0x20,0x1e - (long)puVar11);
          card[0x1e] = '\0';
          puVar11 = (undefined1 *)0x1e;
        }
        goto LAB_00139d3b;
      }
LAB_00139ca0:
      ffxmsg(5,"The following keyword + value is too long to fit on a card:");
      ffxmsg(5,local_e8);
      pcVar7 = local_108;
LAB_00139900:
      ffxmsg(5,pcVar7);
      *status = 0xcf;
      return 0xcf;
    }
LAB_00139c97:
    puVar9 = puVar10 + local_f8;
    if ((undefined1 *)0x50 < puVar9) goto LAB_00139ca0;
    if (puVar9 < (undefined1 *)0x1e) {
      strncat(card,"                    ",0x1e - (long)puVar9);
    }
    strncat(card,local_108,0x50 - (long)puVar10);
    puVar11 = (undefined1 *)0x1e;
    if ((undefined1 *)0x1e < puVar9) {
      puVar11 = puVar9;
    }
LAB_00139d3b:
    pcVar7 = local_100;
    if (((local_100 == (char *)0x0) || ((undefined1 *)0x4c < puVar11)) || (*local_100 == '\0'))
    goto LAB_00139d77;
    sVar6 = strlen(card);
    builtin_strncpy(card + sVar6," / ",4);
    sVar6 = 0x4d - (long)puVar11;
  }
  strncat(card,pcVar7,sVar6);
LAB_00139d77:
  if ((iVar4 == 1) || (bVar3)) {
    ffxmsg(5,"Warning: the following keyword does not conform to the HIERARCH convention");
    ffxmsg(5,card);
  }
  return *status;
}

Assistant:

int ffmkky(const char *keyname,   /* I - keyword name    */
            char *value,     /* I - keyword value   */
            const char *comm,      /* I - keyword comment */
            char *card,      /* O - constructed keyword card */
            int  *status)    /* IO - status value   */
/*
  Make a complete FITS 80-byte keyword card from the input name, value and
  comment strings. Output card is null terminated without any trailing blanks.
*/
{
    size_t namelen, len, ii;
    char tmpname[FLEN_KEYWORD], tmpname2[FLEN_KEYWORD],*cptr;
    char *saveptr;
    int tstatus = -1, nblank = 0, ntoken = 0, maxlen = 0, specialchar = 0;

    if (*status > 0)
        return(*status);

    *tmpname = '\0';
    *tmpname2 = '\0';
    *card = '\0';

    /* skip leading blanks in the name */
    while(*(keyname + nblank) == ' ')
        nblank++;

    strncat(tmpname, keyname + nblank, FLEN_KEYWORD - 1);

    len = strlen(value);        
    namelen = strlen(tmpname);

    /* delete non-significant trailing blanks in the name */
    if (namelen) {
        cptr = tmpname + namelen - 1;

        while(*cptr == ' ') {
            *cptr = '\0';
            cptr--;
        }

        namelen = cptr - tmpname + 1;
    }
    
    /* check that the name does not contain an '=' (equals sign) */
    if (strchr(tmpname, '=') ) {
        ffpmsg("Illegal keyword name; contains an equals sign (=)");
        ffpmsg(tmpname);
        return(*status = BAD_KEYCHAR);
    }

    if (namelen <= 8 && fftkey(tmpname, &tstatus) <= 0 ) { 
    
        /* a normal 8-char (or less) FITS keyword. */
        strcat(card, tmpname);   /* copy keyword name to buffer */
   
        for (ii = namelen; ii < 8; ii++)
            card[ii] = ' ';      /* pad keyword name with spaces */

        card[8]  = '=';          /* append '= ' in columns 9-10 */
        card[9]  = ' ';
        card[10] = '\0';        /* terminate the partial string */
        namelen = 10;
    } else if ((FSTRNCMP(tmpname, "HIERARCH ", 9) == 0) || 
               (FSTRNCMP(tmpname, "hierarch ", 9) == 0) ) {

        /* this is an explicit ESO HIERARCH keyword */

        strcat(card, tmpname);  /* copy keyword name to buffer */

        if (namelen + 3 + len > 80) {
            /* save 1 char by not putting a space before the equals sign */
            strcat(card, "= ");
            namelen += 2;
        } else {
            strcat(card, " = ");
            namelen += 3;
        }
    } else {

	/* scan the keyword name to determine the number and max length of the tokens */
	/* and test if any of the tokens contain nonstandard characters */
	
      	strncat(tmpname2, tmpname, FLEN_KEYWORD - 1);
        cptr = ffstrtok(tmpname2, " ",&saveptr);
	while (cptr) {
	    if (strlen(cptr) > maxlen) maxlen = strlen(cptr); /* find longest token */

	    /* name contains special characters? */
            tstatus = -1;  /* suppress any error message */
	    if (fftkey(cptr, &tstatus) > 0) specialchar = 1; 
	    
	    cptr = ffstrtok(NULL, " ",&saveptr);
	    ntoken++;
	}

        tstatus = -1;  /* suppress any error message */

/*      if (ntoken > 1) { */
        if (ntoken > 0) {  /*  temporarily change so that this case should always be true  */
	    /* for now at least, treat all cases as an implicit ESO HIERARCH keyword. */
	    /* This could  change if FITS is ever expanded to directly support longer keywords. */
	    
            if (namelen + 11 > FLEN_CARD-1)
            {
                ffpmsg(
               "The following keyword is too long to fit on a card:");
                ffpmsg(keyname);
                return(*status = BAD_KEYCHAR);
            }
            strcat(card, "HIERARCH ");
            strcat(card, tmpname);
	    namelen += 9;

            if (namelen + 3 + len > 80) {
                /* save 1 char by not putting a space before the equals sign */
                strcat(card, "= ");
                namelen += 2;
            } else {
                strcat(card, " = ");
                namelen += 3;
            }

	} else if ((fftkey(tmpname, &tstatus) <= 0)) {
          /* should never get here (at least for now) */
            /* allow keyword names longer than 8 characters */

            strncat(card, tmpname, FLEN_KEYWORD - 1);
            strcat(card, "= ");
            namelen += 2;
        } else {
          /* should never get here (at least for now) */
            ffpmsg("Illegal keyword name:");
            ffpmsg(tmpname);
            return(*status = BAD_KEYCHAR);
        }
    }

    if (len > 0)  /* now process the value string */
    {
        if (value[0] == '\'')  /* is this a quoted string value? */
        {
            if (namelen > 77)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);

            /* restore the closing quote if it got truncated */
            if (len == 80)
            {
                   card[79] = '\'';
            }

            if (comm)
            {
              if (comm[0] != 0)
              {
                if (len < 30)
                {
                  for (ii = len; ii < 30; ii++)
                    card[ii] = ' '; /* fill with spaces to col 30 */

                  card[30] = '\0';
                  len = 30;
                }
              }
            }
        }
        else
        {
            if (namelen + len > 80)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }
            else if (namelen + len < 30)
            {
                /* add spaces so field ends at least in col 30 */
                strncat(card, "                    ", 30 - (namelen + len));
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);
            len = maxvalue(30, len);
        }

        if (comm)
        {
          if ((len < 77) && ( strlen(comm) > 0) )  /* room for a comment? */
          {
            strcat(card, " / ");   /* append comment separator */
            strncat(card, comm, 77 - len); /* append comment (what fits) */
          } 
        }
    }
    else
    {
      if (namelen == 10)  /* This case applies to normal keywords only */
      {
        card[8] = ' '; /* keywords with no value have no '=' */ 
        if (comm)
        {
          strncat(card, comm, 80 - namelen); /* append comment (what fits) */
        }
      }
    }

    /* issue a warning if this keyword does not strictly conform to the standard
	       HIERARCH convention, which requires,
	         1) at least 2 tokens in the name,
		 2) no tokens longer than 8 characters, and
		 3) no special characters in any of the tokens */

            if (ntoken == 1 || specialchar == 1) {
	       ffpmsg("Warning: the following keyword does not conform to the HIERARCH convention");
	     /*  ffpmsg(" (e.g., name is not hierarchical or contains non-standard characters)."); */
	       ffpmsg(card);
	    }

    return(*status);
}